

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

string * __thiscall
helics::Federate::queryComplete_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,QueryId *queryIndex)

{
  uint uVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  handle asyncInfo;
  string local_50;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_30;
  unique_lock<std::mutex> local_28;
  
  if (this->singleThreadFederate == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "Async queries are not allowed when using single thread federates","");
    generateJsonErrorResponse(__return_storage_ptr__,METHOD_NOT_ALLOWED,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_30 = (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl;
    local_28._M_device = &local_30->m_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    uVar1 = queryIndex->ivalue;
    p_Var2 = (_Rb_tree_header *)((long)&(local_30->m_obj).inFlightQueries._M_t + 8);
    p_Var3 = (_Base_ptr)p_Var2;
    for (p_Var4 = *(_Base_ptr *)((long)&(local_30->m_obj).inFlightQueries._M_t + 0x10);
        p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)uVar1])
    {
      if ((int)uVar1 <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = (_Base_ptr)p_Var2;
    if (((_Rb_tree_header *)p_Var3 != p_Var2) &&
       (p_Var4 = p_Var3, (int)uVar1 < (int)p_Var3[1]._M_color)) {
      p_Var4 = (_Base_ptr)p_Var2;
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"No Async queries are available","");
      generateJsonErrorResponse(__return_storage_ptr__,METHOD_NOT_ALLOWED,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get(__return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&p_Var4[1]._M_parent);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Federate::queryComplete(QueryId queryIndex)  // NOLINT
{
    if (singleThreadFederate) {
        return generateJsonErrorResponse(
            JsonErrorCodes::METHOD_NOT_ALLOWED,
            "Async queries are not allowed when using single thread federates");
    }
    auto asyncInfo = asyncCallInfo->lock();
    auto fnd = asyncInfo->inFlightQueries.find(queryIndex.value());
    if (fnd != asyncInfo->inFlightQueries.end()) {
        return fnd->second.get();
    }
    return generateJsonErrorResponse(JsonErrorCodes::METHOD_NOT_ALLOWED,
                                     "No Async queries are available");
}